

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SnapshotRecord.h
# Opt level: O0

Entry * __thiscall
cali::SnapshotView::get_immediate_entry
          (Entry *__return_storage_ptr__,SnapshotView *this,Attribute *attr)

{
  cali_id_t cVar1;
  const_iterator pEVar2;
  Node *pNVar3;
  cali_id_t cVar4;
  Entry *e;
  const_iterator __end2;
  const_iterator __begin2;
  SnapshotView *__range2;
  cali_id_t attr_id;
  Attribute *attr_local;
  SnapshotView *this_local;
  
  cVar1 = Attribute::id(attr);
  __end2 = begin(this);
  pEVar2 = end(this);
  do {
    if (__end2 == pEVar2) {
      Entry::Entry(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    pNVar3 = Entry::node(__end2);
    if (pNVar3 != (Node *)0x0) {
      pNVar3 = Entry::node(__end2);
      cVar4 = Node::id(pNVar3);
      if (cVar4 == cVar1) {
        __return_storage_ptr__->m_node = __end2->m_node;
        (__return_storage_ptr__->m_value).m_v.type_and_size = (__end2->m_value).m_v.type_and_size;
        (__return_storage_ptr__->m_value).m_v.value = (__end2->m_value).m_v.value;
        return __return_storage_ptr__;
      }
    }
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

Entry get_immediate_entry(const Attribute& attr) const
    {
        cali_id_t attr_id = attr.id();
        for (const Entry& e : *this) {
            if (e.node() && e.node()->id() == attr_id)
                return e;
        }

        return Entry();
    }